

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall Rml::Context::SetDensityIndependentPixelRatio(Context *this,float dp_ratio)

{
  int iVar1;
  pointer pEVar2;
  Element *this_00;
  ElementDocument *this_01;
  ElementDocument *document;
  int i;
  float dp_ratio_local;
  Context *this_local;
  
  if ((this->density_independent_pixel_ratio != dp_ratio) ||
     (NAN(this->density_independent_pixel_ratio) || NAN(dp_ratio))) {
    this->density_independent_pixel_ratio = dp_ratio;
    document._0_4_ = 0;
    while( true ) {
      pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                         (&this->root);
      iVar1 = Element::GetNumChildren(pEVar2,true);
      if (iVar1 <= (int)document) break;
      pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                         (&this->root);
      this_00 = Element::GetChild(pEVar2,(int)document);
      this_01 = Element::GetOwnerDocument(this_00);
      if (this_01 != (ElementDocument *)0x0) {
        ElementDocument::DirtyMediaQueries(this_01);
        Element::OnDpRatioChangeRecursive(&this_01->super_Element);
      }
      document._0_4_ = (int)document + 1;
    }
  }
  return;
}

Assistant:

void Context::SetDensityIndependentPixelRatio(float dp_ratio)
{
	if (density_independent_pixel_ratio != dp_ratio)
	{
		density_independent_pixel_ratio = dp_ratio;

		for (int i = 0; i < root->GetNumChildren(true); ++i)
		{
			ElementDocument* document = root->GetChild(i)->GetOwnerDocument();
			if (document)
			{
				document->DirtyMediaQueries();
				document->OnDpRatioChangeRecursive();
			}
		}
	}
}